

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

int calculate_boost_bits(int frame_count,int boost,int64_t total_group_bits)

{
  undefined4 local_2c;
  undefined8 local_28;
  int divisor;
  int allocation_chunks;
  int64_t total_group_bits_local;
  int boost_local;
  int frame_count_local;
  undefined4 local_4;
  
  if ((boost == 0) || (total_group_bits < 1)) {
    local_4 = 0;
  }
  else if (frame_count < 1) {
    local_28 = total_group_bits;
    if (0x7ffffffe < total_group_bits) {
      local_28 = 0x7fffffff;
    }
    local_4 = (int)local_28;
  }
  else {
    allocation_chunks = frame_count * 100 + boost;
    boost_local = boost;
    if (0x3ff < boost) {
      boost_local = boost / (boost >> 10);
      allocation_chunks = allocation_chunks / (boost >> 10);
    }
    if ((int)((boost_local * total_group_bits) / (long)allocation_chunks) < 1) {
      local_2c = 0;
    }
    else {
      local_2c = (int)((boost_local * total_group_bits) / (long)allocation_chunks);
    }
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

static int calculate_boost_bits(int frame_count, int boost,
                                int64_t total_group_bits) {
  int allocation_chunks;

  // return 0 for invalid inputs (could arise e.g. through rounding errors)
  if (!boost || (total_group_bits <= 0)) return 0;

  if (frame_count <= 0) return (int)(AOMMIN(total_group_bits, INT_MAX));

  allocation_chunks = (frame_count * 100) + boost;

  // Prevent overflow.
  if (boost > 1023) {
    int divisor = boost >> 10;
    boost /= divisor;
    allocation_chunks /= divisor;
  }

  // Calculate the number of extra bits for use in the boosted frame or frames.
  return AOMMAX((int)(((int64_t)boost * total_group_bits) / allocation_chunks),
                0);
}